

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::blend_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy)

{
  long y_00;
  long y_01;
  ulong a;
  ulong r;
  long lVar1;
  long lVar2;
  ulong g;
  ulong uVar3;
  ssize_t x_00;
  long x_01;
  bool bVar4;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  uint64_t local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  ssize_t local_a8;
  ssize_t local_a0;
  ssize_t local_98;
  ssize_t local_90;
  ssize_t local_88;
  ssize_t local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  ssize_t local_38;
  
  local_a0 = w;
  if (w < 0) {
    local_a0 = source->width;
  }
  local_a8 = h;
  if (h < 0) {
    local_a8 = source->height;
  }
  local_98 = y;
  local_38 = x;
  clamp_blit_dimensions(this,source,&local_38,&local_98,&local_a0,&local_a8,&sx,&sy);
  local_78 = sx;
  local_80 = sy;
  local_88 = local_38;
  local_60 = 0;
  local_70 = local_a0;
  if (local_a0 < 1) {
    local_70 = local_60;
  }
  local_90 = local_98;
  local_68 = local_a8;
  if (local_a8 < 1) {
    local_68 = local_60;
  }
  do {
    if (local_60 == local_68) {
      return;
    }
    y_00 = local_80 + local_60;
    y_01 = local_90 + local_60;
    lVar1 = local_70;
    x_00 = local_88;
    x_01 = local_78;
    while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
      read_pixel(source,x_01,y_00,&local_b0,&local_b8,&local_c0,&local_c8);
      a = local_c8;
      r = local_b0;
      g = local_b8;
      uVar3 = local_c0;
      if (local_c8 == this->max_value) {
LAB_0011258c:
        write_pixel(this,x_00,y_01,r,g,uVar3,a);
      }
      else if (local_c8 != 0) {
        read_pixel(this,x_00,y_01,&local_40,&local_48,&local_50,&local_58);
        uVar3 = this->max_value;
        lVar2 = uVar3 - local_c8;
        a = (lVar2 * local_58 + local_c8 * local_c8) / uVar3;
        r = (local_40 * lVar2 + local_b0 * local_c8) / uVar3;
        g = (local_48 * lVar2 + local_b8 * local_c8) / uVar3;
        uVar3 = (local_50 * lVar2 + local_c0 * local_c8) / uVar3;
        goto LAB_0011258c;
      }
      x_01 = x_01 + 1;
      x_00 = x_00 + 1;
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void Image::blend_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);
      if (sa == this->max_value) {
        this->write_pixel(x + xx, y + yy, sr, sg, sb, sa);
      } else if (sa != 0x00) {
        uint64_t dr, dg, db, da;
        this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);
        this->write_pixel(x + xx, y + yy,
            (sr * sa + dr * (this->max_value - sa)) / this->max_value,
            (sg * sa + dg * (this->max_value - sa)) / this->max_value,
            (sb * sa + db * (this->max_value - sa)) / this->max_value,
            (sa * sa + da * (this->max_value - sa)) / this->max_value);
      }
    }
  }
}